

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccs_test.cpp
# Opt level: O0

void __thiscall CcsTest_DomainBuilder_Test::TestBody(CcsTest_DomainBuilder_Test *this)

{
  bool bVar1;
  string *psVar2;
  char *pcVar3;
  fd_set *__writefds;
  fd_set *in_R8;
  timeval *in_R9;
  AssertHelper local_4a8;
  Message local_4a0;
  allocator local_491;
  string local_490;
  allocator local_469;
  string local_468 [32];
  CcsContext local_448;
  undefined1 local_438 [8];
  AssertionResult gtest_ar_2;
  Message local_420;
  allocator local_411;
  string local_410;
  allocator local_3e9;
  string local_3e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3c8;
  allocator local_3a9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3a8;
  CcsContext local_388;
  undefined1 local_378 [8];
  AssertionResult gtest_ar_1;
  Message local_360;
  allocator local_351;
  string local_350;
  undefined1 local_330 [8];
  AssertionResult gtest_ar;
  CcsContext ctx;
  string local_308 [39];
  allocator local_2e1;
  string local_2e0;
  allocator local_2b9;
  string local_2b8;
  undefined1 local_298 [32];
  undefined1 local_278 [40];
  string local_250 [39];
  allocator local_229;
  string local_228;
  allocator local_201;
  undefined1 local_200 [40];
  undefined1 local_1d8 [40];
  string local_1b0;
  allocator local_189;
  string local_188;
  undefined1 local_168 [32];
  undefined1 local_148 [40];
  string local_120 [39];
  allocator local_f9;
  string local_f8;
  string local_c8;
  string local_a8;
  RuleBuilder local_88;
  string local_78;
  RuleBuilder local_58;
  string local_48;
  RuleBuilder local_28;
  CcsDomain local_18;
  CcsDomain ccs;
  CcsTest_DomainBuilder_Test *this_local;
  
  ccs.dag._M_t.super___uniq_ptr_impl<ccs::DagBuilder,_std::default_delete<ccs::DagBuilder>_>._M_t.
  super__Tuple_impl<0UL,_ccs::DagBuilder_*,_std::default_delete<ccs::DagBuilder>_>.
  super__Head_base<0UL,_ccs::DagBuilder_*,_false>._M_head_impl =
       (unique_ptr<ccs::DagBuilder,_std::default_delete<ccs::DagBuilder>_>)
       (unique_ptr<ccs::DagBuilder,_std::default_delete<ccs::DagBuilder>_>)this;
  ::ccs::CcsDomain::CcsDomain(&local_18,false);
  ::ccs::CcsDomain::ruleBuilder((CcsDomain *)&local_c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"a",&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"base",(allocator *)(local_148 + 0x27));
  ::ccs::RuleBuilder::set((RuleBuilder *)&local_c8.field_2,&local_c8,&local_f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_148,"a",(allocator *)(local_168 + 0x1f));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_188,"b",&local_189);
  anon_unknown.dwarf_25890::v
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_168,&local_188);
  ::ccs::RuleBuilder::select
            ((RuleBuilder *)&local_a8,(int)&local_c8 + 0x10,(fd_set *)local_148,(fd_set *)local_168,
             in_R8,in_R9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b0,"a",(allocator *)(local_1d8 + 0x27));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_1d8,"123",(allocator *)(local_200 + 0x27));
  __writefds = (fd_set *)local_1d8;
  ::ccs::RuleBuilder::set((RuleBuilder *)&local_a8.field_2,&local_a8,&local_1b0);
  ::ccs::RuleBuilder::pop(&local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_200,"c",&local_201);
  ::ccs::RuleBuilder::select
            ((RuleBuilder *)&local_78,(int)&local_88,(fd_set *)local_200,__writefds,in_R8,in_R9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_228,"b",&local_229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,"true",(allocator *)(local_278 + 0x27));
  ::ccs::RuleBuilder::set((RuleBuilder *)&local_78.field_2,&local_78,&local_228);
  ::ccs::RuleBuilder::pop(&local_58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_278,"c",(allocator *)(local_298 + 0x1f));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2b8,"d",&local_2b9);
  anon_unknown.dwarf_25890::v
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_298,&local_2b8);
  ::ccs::RuleBuilder::select
            ((RuleBuilder *)&local_48,(int)&local_58,(fd_set *)local_278,(fd_set *)local_298,in_R8,
             in_R9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2e0,"b",&local_2e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_308,"false",
             (allocator *)
             ((long)&ctx.searchState.
                     super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  ::ccs::RuleBuilder::set((RuleBuilder *)&local_48.field_2,&local_48,&local_2e0);
  ::ccs::RuleBuilder::pop(&local_28);
  ::ccs::RuleBuilder::~RuleBuilder(&local_28);
  ::ccs::RuleBuilder::~RuleBuilder((RuleBuilder *)&local_48.field_2);
  std::__cxx11::string::~string(local_308);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&ctx.searchState.
                     super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  std::__cxx11::string::~string((string *)&local_2e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
  ::ccs::RuleBuilder::~RuleBuilder((RuleBuilder *)&local_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_298);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  std::__cxx11::string::~string((string *)local_278);
  std::allocator<char>::~allocator((allocator<char> *)(local_298 + 0x1f));
  ::ccs::RuleBuilder::~RuleBuilder(&local_58);
  ::ccs::RuleBuilder::~RuleBuilder((RuleBuilder *)&local_78.field_2);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator((allocator<char> *)(local_278 + 0x27));
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  ::ccs::RuleBuilder::~RuleBuilder((RuleBuilder *)&local_78);
  std::__cxx11::string::~string((string *)local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  ::ccs::RuleBuilder::~RuleBuilder(&local_88);
  ::ccs::RuleBuilder::~RuleBuilder((RuleBuilder *)&local_a8.field_2);
  std::__cxx11::string::~string((string *)local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)(local_200 + 0x27));
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)(local_1d8 + 0x27));
  ::ccs::RuleBuilder::~RuleBuilder((RuleBuilder *)&local_a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_168);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  std::__cxx11::string::~string((string *)local_148);
  std::allocator<char>::~allocator((allocator<char> *)(local_168 + 0x1f));
  ::ccs::RuleBuilder::~RuleBuilder((RuleBuilder *)&local_c8.field_2);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)(local_148 + 0x27));
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  ::ccs::RuleBuilder::~RuleBuilder((RuleBuilder *)&local_c8);
  ::ccs::CcsDomain::build((CcsDomain *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_350,"a",&local_351);
  psVar2 = ::ccs::CcsContext::getString((CcsContext *)&gtest_ar.message_,&local_350);
  testing::internal::EqHelper::
  Compare<char[5],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_330,"\"base\"","ctx.getString(\"a\")",(char (*) [5])"base",psVar2);
  std::__cxx11::string::~string((string *)&local_350);
  std::allocator<char>::~allocator((allocator<char> *)&local_351);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
  if (!bVar1) {
    testing::Message::Message(&local_360);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_330);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/ccs_test.cpp"
               ,0xc1,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_360);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_360);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3a8,"a",&local_3a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3e8,"b",&local_3e9);
  anon_unknown.dwarf_25890::v(&local_3c8,&local_3e8);
  ::ccs::CcsContext::constrain(&local_388,(string *)&gtest_ar.message_,&local_3a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_410,"a",&local_411);
  psVar2 = ::ccs::CcsContext::getString(&local_388,&local_410);
  testing::internal::EqHelper::
  Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_378,"\"123\"","ctx.constrain(\"a\", v(\"b\")).getString(\"a\")",
             (char (*) [4])0x1f976e,psVar2);
  std::__cxx11::string::~string((string *)&local_410);
  std::allocator<char>::~allocator((allocator<char> *)&local_411);
  ::ccs::CcsContext::~CcsContext(&local_388);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3c8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_378);
  if (!bVar1) {
    testing::Message::Message(&local_420);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_378);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/ccs_test.cpp"
               ,0xc2,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_420);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_420);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_378);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_468,"c",&local_469);
  ::ccs::CcsContext::constrain(&local_448,(string *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_490,"a",&local_491);
  psVar2 = ::ccs::CcsContext::getString(&local_448,&local_490);
  testing::internal::EqHelper::
  Compare<char[5],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_438,"\"base\"","ctx.constrain(\"c\").getString(\"a\")",
             (char (*) [5])"base",psVar2);
  std::__cxx11::string::~string((string *)&local_490);
  std::allocator<char>::~allocator((allocator<char> *)&local_491);
  ::ccs::CcsContext::~CcsContext(&local_448);
  std::__cxx11::string::~string(local_468);
  std::allocator<char>::~allocator((allocator<char> *)&local_469);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_438);
  if (!bVar1) {
    testing::Message::Message(&local_4a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_438);
    testing::internal::AssertHelper::AssertHelper
              (&local_4a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/ccs_test.cpp"
               ,0xc3,pcVar3);
    testing::internal::AssertHelper::operator=(&local_4a8,&local_4a0);
    testing::internal::AssertHelper::~AssertHelper(&local_4a8);
    testing::Message::~Message(&local_4a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_438);
  ::ccs::CcsContext::~CcsContext((CcsContext *)&gtest_ar.message_);
  ::ccs::CcsDomain::~CcsDomain(&local_18);
  return;
}

Assistant:

TEST(CcsTest, DomainBuilder) {
  CcsDomain ccs;
  ccs.ruleBuilder()
      .set("a", "base")
      .select("a", v("b")).set("a", "123").pop()
      .select("c").set("b", "true").pop()
      .select("c", v("d")).set("b", "false").pop();
  CcsContext ctx = ccs.build();
  EXPECT_EQ("base", ctx.getString("a"));
  EXPECT_EQ("123", ctx.constrain("a", v("b")).getString("a"));
  EXPECT_EQ("base", ctx.constrain("c").getString("a"));
}